

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DisjunctiveIntervalMap.h
# Opt level: O3

DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset> * __thiscall
dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset>::intersection
          (DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset> *__return_storage_ptr__,
          DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset> *this,
          DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset> *rhs)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  _Base_ptr p_Var3;
  _Rb_tree_header *p_Var4;
  set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_> vals;
  IntervalT local_70;
  _Rb_tree<dg::dda::RWNode_*,_dg::dda::RWNode_*,_std::_Identity<dg::dda::RWNode_*>,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>
  local_60;
  
  p_Var4 = &(__return_storage_ptr__->_mapping)._M_t._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_mapping)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_mapping)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (__return_storage_ptr__->_mapping)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var4->_M_header;
  (__return_storage_ptr__->_mapping)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var4->_M_header;
  (__return_storage_ptr__->_mapping)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var3 = (rhs->_mapping)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var4 = &(rhs->_mapping)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var3 != p_Var4) {
    p_Var2 = (this->_mapping)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var1 = &local_60._M_impl.super__Rb_tree_header;
    do {
      if (p_Var2[1]._M_parent < *(_Base_ptr *)(p_Var3 + 1)) {
        return __return_storage_ptr__;
      }
      if ((*(_Base_ptr *)(p_Var2 + 1) <= *(_Base_ptr *)(p_Var3 + 1)) ||
         (*(_Base_ptr *)(p_Var2 + 1) <= p_Var3[1]._M_parent)) {
        local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_60._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
        local_60._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
        std::
        __set_intersection<std::_Rb_tree_const_iterator<dg::dda::RWNode*>,std::_Rb_tree_const_iterator<dg::dda::RWNode*>,std::insert_iterator<std::set<dg::dda::RWNode*,std::less<dg::dda::RWNode*>,std::allocator<dg::dda::RWNode*>>>,__gnu_cxx::__ops::_Iter_less_iter>
                  (p_Var2[2]._M_parent,&p_Var2[1]._M_right,p_Var3[2]._M_parent,&p_Var3[1]._M_right,
                   &local_60,p_Var1);
        local_70.start.offset = *(ulong *)(p_Var3 + 1);
        if (*(ulong *)(p_Var3 + 1) < *(ulong *)(p_Var2 + 1)) {
          local_70.start.offset = *(ulong *)(p_Var2 + 1);
        }
        local_70.end.offset = (type)p_Var2[1]._M_parent;
        if (p_Var3[1]._M_parent < p_Var2[1]._M_parent) {
          local_70.end.offset = (type)p_Var3[1]._M_parent;
        }
        DisjunctiveIntervalMap<dg::dda::RWNode*,dg::Offset>::
        add<std::set<dg::dda::RWNode*,std::less<dg::dda::RWNode*>,std::allocator<dg::dda::RWNode*>>>
                  ((DisjunctiveIntervalMap<dg::dda::RWNode*,dg::Offset> *)__return_storage_ptr__,
                   &local_70,
                   (set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>
                    *)&local_60);
        std::
        _Rb_tree<dg::dda::RWNode_*,_dg::dda::RWNode_*,_std::_Identity<dg::dda::RWNode_*>,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>
        ::_M_erase(&local_60,(_Link_type)local_60._M_impl.super__Rb_tree_header._M_header._M_parent)
        ;
      }
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
    } while ((_Rb_tree_header *)p_Var3 != p_Var4);
  }
  return __return_storage_ptr__;
}

Assistant:

DisjunctiveIntervalMap
    intersection(const DisjunctiveIntervalMap &rhs) const {
        DisjunctiveIntervalMap tmp;
        // FIXME: this could be done more efficiently
        auto it = _mapping.begin();
        for (auto &rhsit : rhs._mapping) {
            while (it->first.end < rhsit.first.start) {
                if (it == _mapping.end()) {
                    return tmp;
                }
            }
            if (it->first.overlaps(rhsit.first)) {
                decltype(rhsit.second) vals;
                std::set_intersection(it->second.begin(), it->second.end(),
                                      rhsit.second.begin(), rhsit.second.end(),
                                      std::inserter(vals, vals.begin()));
                tmp.add(IntervalT{std::max(it->first.start, rhsit.first.start),
                                  std::min(it->first.end, rhsit.first.end)},
                        vals);
            }
        }
        return tmp;
    }